

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O0

void __thiscall
max_flow_algo::max_flow_algo
          (max_flow_algo *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adjj,vector<int,_std::allocator<int>_> *x)

{
  size_type sVar1;
  reference this_00;
  reference this_01;
  ulong uVar2;
  value_type_conflict1 local_34;
  int local_30;
  int i;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *x_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *adjj_local;
  max_flow_algo *this_local;
  
  this->WORK_OP_RELABEL = 9;
  this->GLOBAL_UPDATE_FRQ = 0.51;
  this->WORK_NODE_TO_EDGES = 4;
  local_20 = x;
  x_local = (vector<int,_std::allocator<int>_> *)adjj;
  adjj_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_excess);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_distance);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_active);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_count);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&this->m_Q);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_bfstouched);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->flow);
  this->adj = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)x_local;
  this->active = local_20;
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(this->adj);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->flow,sVar1);
  local_30 = 0;
  while( true ) {
    uVar2 = (ulong)local_30;
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(this->adj);
    if (sVar1 <= uVar2) break;
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->flow,(long)local_30);
    this_01 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](this->adj,(long)local_30);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(this_01);
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::resize(this_00,sVar1,&local_34);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

max_flow_algo(std::vector<std::vector<int>> &adjj, std::vector<int> &x)
        : adj(adjj), active(x)
    {
        flow.resize(adj.size());

        for (int i = 0; i < adj.size(); i++)
        {
            flow[i].resize(adj[i].size(), 0);
        }
    }